

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::VertexShaderTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,VertexShaderTestInstance *this)

{
  deInt32 *pdVar1;
  undefined8 cmdBuffer;
  deUint32 _queueFamilyIndex;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  SharedPtr<vkt::Draw::Buffer> vertexBufferSp;
  Move<vk::Handle<(vk::HandleType)11>_> local_138;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> local_118;
  VkQueryPool local_f8;
  Deleter<vk::Handle<(vk::HandleType)11>_> DStack_f0;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Move<vk::Handle<(vk::HandleType)24>_> local_c8;
  VkCommandBufferBeginInfo info;
  pointer local_68;
  pointer local_58;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  
  vk = Context::getDeviceInterface
                 ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  device = Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  queue = Context::getUniversalQueue
                    ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                     super_TestInstance.m_context);
  _queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,_queueFamilyIndex
             ,2);
  ::vk::createCommandPool
            (&local_c8,vk,device,&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,
             (VkAllocationCallbacks *)0x0);
  info.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
  info.pNext = (void *)0x0;
  info.flags = 0;
  info._20_4_ = 1;
  info.pInheritanceInfo =
       (VkCommandBufferInheritanceInfo *)
       CONCAT44(((this->super_GraphicBasicTestInstance).m_parametersGraphic)->queryStatisticFlags,1)
  ;
  ::vk::createQueryPool
            (&local_138,vk,device,(VkQueryPoolCreateInfo *)&info,(VkAllocationCallbacks *)0x0);
  local_f8.m_internal =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
  DStack_f0.m_deviceIface =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface;
  vertexBufferOffset = 0;
  GraphicBasicTestInstance::creatAndFillVertexBuffer((GraphicBasicTestInstance *)&vertexBufferSp);
  vertexBuffer.m_internal =
       ((vertexBufferSp.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
       object.m_internal;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&info,vk,device,
             (VkCommandPool)
             local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  cmdBuffer = info._0_8_;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device._0_4_ =
       info.flags;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device._4_4_ =
       info._20_4_;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator._0_4_ =
       info.pInheritanceInfo._0_4_;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator._4_4_ =
       info.pInheritanceInfo._4_4_;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal = info._0_8_;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)info.pNext;
  info.flags = 1;
  info._20_4_ = 0;
  info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  info._4_4_ = 0;
  info.pNext = (void *)0x0;
  result = (*vk->_vptr_DeviceInterface[0x49])(vk,cmdBuffer);
  ::vk::checkResult(result,"vk.beginCommandBuffer(commandBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x75);
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *(float *)(local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
             _M_impl.super__Vector_impl_data._M_start + 1) = 0.0;
  *(deUint32 *)
   ((long)(local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl
           .super__Vector_impl_data._M_start + 1) + 4) = 0;
  *(undefined8 *)
   ((long)local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 0x18) = 0;
  *(float *)local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
            _M_impl.super__Vector_impl_data._M_start = 0.0;
  *(deUint32 *)
   ((long)local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 8) = 0;
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            ((RenderPassBeginInfo *)&info,
             (VkRenderPass)
             (this->super_GraphicBasicTestInstance).m_renderPass.
             super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
             (VkFramebuffer)
             (this->super_GraphicBasicTestInstance).m_framebuffer.
             super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal,
             (VkRect2D)(ZEXT816(0x4000000040) << 0x40),&local_118);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)cmdBuffer,
             (VkImage)(((this->super_GraphicBasicTestInstance).m_colorAttachmentImage.m_ptr)->
                      m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,1,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,0,0x100);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)cmdBuffer,
             (VkImage)(((this->super_GraphicBasicTestInstance).m_depthImage.m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,2,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0,0x400);
  (*vk->_vptr_DeviceInterface[0x70])(vk,cmdBuffer,local_f8.m_internal,0,1);
  (*vk->_vptr_DeviceInterface[0x74])(vk,cmdBuffer,&info,0);
  (*vk->_vptr_DeviceInterface[0x6e])(vk,cmdBuffer,local_f8.m_internal,0,0);
  (*vk->_vptr_DeviceInterface[0x58])(vk,cmdBuffer,0,1,&vertexBuffer,&vertexBufferOffset);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,cmdBuffer,0,
             (this->super_GraphicBasicTestInstance).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  (*(this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.super_TestInstance.
    _vptr_TestInstance[7])(this,cmdBuffer);
  (*vk->_vptr_DeviceInterface[0x6f])(vk,cmdBuffer,local_f8.m_internal,0);
  (*vk->_vptr_DeviceInterface[0x76])(vk,cmdBuffer);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)cmdBuffer,
             (VkImage)(((this->super_GraphicBasicTestInstance).m_colorAttachmentImage.m_ptr)->
                      m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,1,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_GENERAL,
             0,0x100);
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (*vk->_vptr_DeviceInterface[0x4a])(vk,cmdBuffer);
  submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)cmdBuffer);
  (*(this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.super_TestInstance.
    _vptr_TestInstance[6])(__return_storage_ptr__,this,local_f8.m_internal);
  if (cmdBuffer != 0) {
    info._0_8_ = cmdBuffer;
    (*(code *)(((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &(local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                m_deviceIface)->_vptr_DeviceInterface)->
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr
              [0x12]._vptr_Allocation)
              (local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface
               ,CONCAT44(local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                         m_device._4_4_,
                         (VkCommandBufferUsageFlags)
                         local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                         m_device),
               CONCAT44(local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                        m_allocator._4_4_,
                        local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                        m_allocator._0_4_),1);
  }
  if (vertexBufferSp.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(vertexBufferSp.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      vertexBufferSp.m_ptr = (Buffer *)0x0;
      (*(vertexBufferSp.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(vertexBufferSp.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (vertexBufferSp.m_state != (SharedPtrStateBase *)0x0)) {
      (*(vertexBufferSp.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()(&DStack_f0,local_f8);
  }
  if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus VertexShaderTestInstance::executeTest (void)
{
	const DeviceInterface&					vk						= m_context.getDeviceInterface();
	const VkDevice							device					= m_context.getDevice();
	const VkQueue							queue					= m_context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();

	const CmdPoolCreateInfo					cmdPoolCreateInfo		(queueFamilyIndex);
	const Move<VkCommandPool>				cmdPool					= createCommandPool(vk, device, &cmdPoolCreateInfo);
	const Unique<VkQueryPool>				queryPool				(makeQueryPool(vk, device, m_parametersGraphic.queryStatisticFlags));

	const VkDeviceSize						vertexBufferOffset		= 0u;
	const de::SharedPtr<Buffer>				vertexBufferSp			= creatAndFillVertexBuffer();
	const VkBuffer							vertexBuffer			= vertexBufferSp->object();

	const Unique<VkCommandBuffer>			cmdBuffer				(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(vk, *cmdBuffer);
	{
		const VkRect2D				renderArea				= { { 0, 0 }, { WIDTH, HEIGHT } };
		std::vector<VkClearValue>	renderPassClearValues	(2);
		deMemset(&renderPassClearValues[0], 0, static_cast<int>(renderPassClearValues.size()) * sizeof(VkClearValue));
		const RenderPassBeginInfo	renderPassBegin			(*m_renderPass, *m_framebuffer, renderArea, renderPassClearValues);

		transition2DImage(vk, *cmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
		transition2DImage(vk, *cmdBuffer, m_depthImage->object(), VK_IMAGE_ASPECT_DEPTH_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT);

		vk.cmdResetQueryPool(*cmdBuffer, *queryPool, 0u, 1u);

		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBegin, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBeginQuery(*cmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
		vk.cmdBindVertexBuffers(*cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		draw(*cmdBuffer);
		vk.cmdEndQuery(*cmdBuffer, *queryPool, 0u);

		vk.cmdEndRenderPass(*cmdBuffer);

		transition2DImage(vk, *cmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL, 0u, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
	}
	vk.endCommandBuffer(*cmdBuffer);

	// Wait for completion
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	return checkResult (*queryPool);
}